

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O3

int Abc_NtkBmSat(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,Vec_Ptr_t *iMatchPairs,Vec_Ptr_t *oMatchPairs,
                Vec_Int_t *mismatch,int mode)

{
  uint uVar1;
  long *plVar2;
  ulong uVar3;
  int iVar4;
  Vec_Ptr_t *vPairs;
  void **ppvVar5;
  Abc_Obj_t *pFanin;
  Abc_Ntk_t *pMiter;
  int *pModel;
  Abc_Ntk_t *pNtk;
  uint uVar6;
  char *__format;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  
  if (mode == 0) {
    pMiter = Abc_NtkMiterBm(pNtk1,pNtk2,iMatchPairs,oMatchPairs);
    if (pMiter != (Abc_Ntk_t *)0x0) {
      iVar4 = Abc_NtkMiterIsConstant(pMiter);
      if (iVar4 == 1) {
        Abc_NtkDelete(pMiter);
        return 1;
      }
      if (iVar4 == 0) {
        if (mismatch != (Vec_Int_t *)0x0) {
          pModel = Abc_NtkVerifyGetCleanModel(pMiter,1);
          pMiter->pModel = pModel;
          Abc_NtkVerifyReportError(pNtk1,pNtk2,pModel,mismatch);
          if (pMiter->pModel != (int *)0x0) {
            free(pMiter->pModel);
            pMiter->pModel = (int *)0x0;
          }
        }
        Abc_NtkDelete(pMiter);
        return 0;
      }
      pNtk = Abc_NtkMulti(pMiter,0,100,1,0,0,0);
      Abc_NtkDelete(pMiter);
      if (pNtk != (Abc_Ntk_t *)0x0) {
        iVar4 = Abc_NtkMiterSat(pNtk,10000,0,0,(ABC_INT64_T *)0x0,(ABC_INT64_T *)0x0);
        if ((mismatch != (Vec_Int_t *)0x0) && (pNtk->pModel != (int *)0x0)) {
          Abc_NtkVerifyReportError(pNtk1,pNtk2,pNtk->pModel,mismatch);
        }
        if (pNtk->pModel != (int *)0x0) {
          free(pNtk->pModel);
          pNtk->pModel = (int *)0x0;
        }
        Abc_NtkDelete(pNtk);
        return iVar4;
      }
      __format = "Renoding for CNF has failed.";
      goto LAB_0023b856;
    }
  }
  else if (mode == 1) {
    vPairs = (Vec_Ptr_t *)malloc(0x10);
    vPairs->nCap = 100;
    vPairs->nSize = 0;
    ppvVar5 = (void **)malloc(800);
    vPairs->pArray = ppvVar5;
    if (0 < *(int *)(_DAT_00000040 + 4)) {
      lVar9 = 0;
      do {
        Abc_ObjRemoveFanins(*(Abc_Obj_t **)(*(long *)(_DAT_00000040 + 8) + lVar9 * 8));
        lVar9 = lVar9 + 1;
      } while (lVar9 < *(int *)(_DAT_00000040 + 4));
    }
    if (0 < oMatchPairs->nSize) {
      uVar6 = 0;
      uVar8 = 100;
      lVar9 = 1;
      do {
        plVar2 = (long *)oMatchPairs->pArray[lVar9 + -1];
        uVar1 = *(uint *)((long)plVar2 + 0x14);
        uVar3 = *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                    (long)*(int *)plVar2[4] * 8) + 0x40);
        uVar7 = (uint)uVar8;
        if (uVar6 == uVar7) {
          if ((int)uVar7 < 0x10) {
            if (vPairs->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(vPairs->pArray,0x80);
            }
            vPairs->pArray = ppvVar5;
            vPairs->nCap = 0x10;
            uVar8 = 0x10;
          }
          else {
            uVar8 = (ulong)(uVar7 * 2);
            if (vPairs->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(uVar8 * 8);
            }
            else {
              ppvVar5 = (void **)realloc(vPairs->pArray,uVar8 * 8);
            }
            vPairs->pArray = ppvVar5;
            vPairs->nCap = uVar7 * 2;
          }
        }
        else {
          ppvVar5 = vPairs->pArray;
        }
        ppvVar5[lVar9 + -1] = (void *)(uVar1 >> 10 & 1 ^ uVar3);
        if (oMatchPairs->nSize <= lVar9) goto LAB_0023b920;
        plVar2 = (long *)oMatchPairs->pArray[lVar9];
        uVar1 = *(uint *)((long)plVar2 + 0x14);
        uVar3 = *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                    (long)*(int *)plVar2[4] * 8) + 0x40);
        if ((int)lVar9 == (int)uVar8) {
          if (uVar6 < 0xf) {
            if (vPairs->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(vPairs->pArray,0x80);
            }
            vPairs->pArray = ppvVar5;
            vPairs->nCap = 0x10;
            uVar8 = 0x10;
          }
          else {
            uVar7 = (int)uVar8 * 2;
            uVar8 = (ulong)uVar7;
            if (vPairs->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(uVar8 * 8);
            }
            else {
              ppvVar5 = (void **)realloc(vPairs->pArray,uVar8 * 8);
            }
            vPairs->pArray = ppvVar5;
            vPairs->nCap = uVar7;
          }
        }
        else {
          ppvVar5 = vPairs->pArray;
        }
        uVar6 = uVar6 + 2;
        vPairs->nSize = uVar6;
        ppvVar5[lVar9] = (void *)(uVar1 >> 10 & 1 ^ uVar3);
        lVar9 = lVar9 + 2;
      } while ((int)uVar6 < oMatchPairs->nSize);
    }
    pFanin = Abc_AigMiter(_DAT_00000100,vPairs,0);
    if (*(int *)(_DAT_00000030 + 4) < 1) {
LAB_0023b920:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    Abc_ObjAddFanin((Abc_Obj_t *)**(undefined8 **)(_DAT_00000030 + 8),pFanin);
    if (vPairs->pArray != (void **)0x0) {
      free(vPairs->pArray);
    }
    free(vPairs);
  }
  __format = "Miter computation has failed.";
LAB_0023b856:
  printf(__format);
  return -1;
}

Assistant:

int Abc_NtkBmSat( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, Vec_Ptr_t * iMatchPairs, Vec_Ptr_t * oMatchPairs, Vec_Int_t * mismatch, int mode)
{    
    extern Abc_Ntk_t * Abc_NtkMulti( Abc_Ntk_t * pNtk, int nThresh, int nFaninMax, int fCnf, int fMulti, int fSimple, int fFactor );	

	Abc_Ntk_t * pMiter = NULL;
    Abc_Ntk_t * pCnf;
    int RetValue;

	// get the miter of the two networks
	if( mode == 0 )
	{
		//Abc_NtkDelete( pMiter );
		pMiter = Abc_NtkMiterBm( pNtk1, pNtk2, iMatchPairs, oMatchPairs );
	}
	else if( mode == 1 )		// add new outputs
	{		
		int i;
		Abc_Obj_t * pObj;
		Vec_Ptr_t * vPairs;
		Abc_Obj_t * pNtkMiter;		

		vPairs = Vec_PtrAlloc( 100 );

		Abc_NtkForEachCo( pMiter, pObj, i )			
			Abc_ObjRemoveFanins( pObj );

		for(i = 0; i < Vec_PtrSize( oMatchPairs ); i += 2)
		{
			Vec_PtrPush( vPairs, Abc_ObjChild0Copy((Abc_Obj_t *)Vec_PtrEntry(oMatchPairs, i)) );
			Vec_PtrPush( vPairs, Abc_ObjChild0Copy((Abc_Obj_t *)Vec_PtrEntry(oMatchPairs, i+1)) );
		}
		pNtkMiter = Abc_AigMiter( (Abc_Aig_t *)pMiter->pManFunc, vPairs, 0 );
		Abc_ObjAddFanin( Abc_NtkPo(pMiter,0), pNtkMiter );	 
		Vec_PtrFree( vPairs);
	}
	else if( mode == 2 )		// add some outputs
	{

	}
	else if( mode == 3)			// remove all outputs
	{
	}

	if ( pMiter == NULL )
	{
		printf("Miter computation has failed.");		
		return -1;
	}
	RetValue = Abc_NtkMiterIsConstant( pMiter );
	if ( RetValue == 0)
	{		
		/*printf("Networks are NOT EQUIVALENT after structural hashing.");	*/
		// report the error    	
		if(mismatch != NULL)
		{
			pMiter->pModel = Abc_NtkVerifyGetCleanModel( pMiter, 1 );
			Abc_NtkVerifyReportError( pNtk1, pNtk2, pMiter->pModel, mismatch );
			ABC_FREE( pMiter->pModel );
		}        
		Abc_NtkDelete( pMiter );
        return RetValue;
	}
	if( RetValue == 1 )
	{		
		/*printf("Networks are equivalent after structural hashing.");	*/
		Abc_NtkDelete( pMiter );
		return RetValue;
	}

	// convert the miter into a CNF
	//if(mode == 0)
	pCnf = Abc_NtkMulti( pMiter, 0, 100, 1, 0, 0, 0 );
    Abc_NtkDelete( pMiter );
    if ( pCnf == NULL )
    {        
		printf("Renoding for CNF has failed.");	
        return -1;
    }

    // solve the CNF using the SAT solver
    RetValue = Abc_NtkMiterSat( pCnf, (ABC_INT64_T)10000, (ABC_INT64_T)0, 0, NULL, NULL);
    /*if ( RetValue == -1 )
		printf("Networks are undecided (SAT solver timed out).");	
    else if ( RetValue == 0 )        
		printf("Networks are NOT EQUIVALENT after SAT.");	
    else
		printf("Networks are equivalent after SAT.");	*/
	if ( mismatch != NULL && pCnf->pModel )
        Abc_NtkVerifyReportError( pNtk1, pNtk2, pCnf->pModel, mismatch );

    ABC_FREE( pCnf->pModel );
    Abc_NtkDelete( pCnf );

	return RetValue;
}